

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token __thiscall slang::parsing::Lexer::lexNumericLiteral(Lexer *this)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  size_type sVar3;
  byte *pbVar4;
  char *pcVar5;
  int *piVar6;
  Diagnostic *this_00;
  byte bVar7;
  bool bVar8;
  int i;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong in_R9;
  LiteralBase base;
  byte *pbVar12;
  double dVar13;
  undefined1 auVar14 [16];
  Token TVar15;
  byte local_f5;
  optional<slang::TimeUnit> timeSuffix;
  bool outOfRange;
  SVInt intVal;
  anon_class_16_2_832c79d4 populateChars;
  SmallVector<char,_40UL> floatChars;
  double value;
  SmallVector<slang::logic_t,_40UL> digits;
  EVP_PKEY_CTX *ctx;
  
  pbVar4 = (byte *)this->sourceBuffer;
  lVar9 = 0;
  while (pbVar12 = pbVar4, pbVar4[lVar9] == "1step"[lVar9]) {
    lVar9 = lVar9 + 1;
    if (lVar9 == 5) {
      this->sourceBuffer = (char *)(pbVar4 + 5);
      TVar15 = create<>(this,OneStep);
      return TVar15;
    }
  }
  while (bVar7 = *pbVar4, bVar7 == 0x30) {
    pbVar4 = pbVar4 + 1;
    this->sourceBuffer = (char *)pbVar4;
    pbVar12 = pbVar12 + 1;
  }
  pcVar1 = this->originalBegin;
  digits.super_SmallVectorBase<slang::logic_t>.data_ =
       (pointer)digits.super_SmallVectorBase<slang::logic_t>.firstElement;
  digits.super_SmallVectorBase<slang::logic_t>.len = 0;
  floatChars.super_SmallVectorBase<char>.data_ = floatChars.super_SmallVectorBase<char>.firstElement
  ;
  floatChars.super_SmallVectorBase<char>.len = 0;
  digits.super_SmallVectorBase<slang::logic_t>.cap = 0x28;
  floatChars.super_SmallVectorBase<char>.cap = 0x28;
  do {
    if (bVar7 != 0x5f) {
      if (9 < (byte)(bVar7 - 0x30)) goto LAB_0034e0b5;
      populateChars.digits =
           (SmallVector<slang::logic_t,_40UL> *)CONCAT71(populateChars.digits._1_7_,bVar7 - 0x30);
      SmallVectorBase<slang::logic_t>::emplace_back<slang::logic_t>
                (&digits.super_SmallVectorBase<slang::logic_t>,(logic_t *)&populateChars);
      pbVar4 = (byte *)this->sourceBuffer;
    }
    this->sourceBuffer = (char *)(pbVar4 + 1);
    bVar7 = pbVar4[1];
    pbVar4 = pbVar4 + 1;
  } while( true );
LAB_0034e129:
  if (!bVar8) {
    intVal.super_SVIntStorage.field_0.val._0_1_ = 0x30;
    SmallVectorBase<char>::emplace_back<char>
              (&floatChars.super_SmallVectorBase<char>,(char *)&intVal);
    pbVar4 = (byte *)this->sourceBuffer;
  }
  goto LAB_0034e144;
LAB_0034e220:
  if (!(bool)(sVar3 == 0 & (bVar8 ^ 1U))) {
    this->sourceBuffer = pcVar5 + uVar10;
    if (!bVar8) {
      intVal.super_SVIntStorage.field_0.val._0_1_ = 0x31;
      SmallVectorBase<char>::emplace_back<char>
                (&floatChars.super_SmallVectorBase<char>,(char *)&intVal);
    }
    bVar7 = 0;
    goto LAB_0034e255;
  }
  floatChars.super_SmallVectorBase<char>.len = 0;
  goto LAB_0034e2c9;
LAB_0034e0b5:
  populateChars.floatChars = &floatChars;
  populateChars.digits =
       (SmallVector<slang::logic_t,_40UL> *)&digits.super_SmallVectorBase<slang::logic_t>;
  if (*pbVar4 == 0x2e) {
    this->sourceBuffer = (char *)(pbVar4 + 1);
    lexNumericLiteral::anon_class_16_2_832c79d4::operator()(&populateChars);
    intVal.super_SVIntStorage.field_0.val._0_1_ = 0x2e;
    SmallVectorBase<char>::emplace_back<char>
              (&floatChars.super_SmallVectorBase<char>,(char *)&intVal);
    pbVar4 = (byte *)this->sourceBuffer;
    bVar8 = false;
    do {
      bVar7 = *pbVar4;
      intVal.super_SVIntStorage.field_0.val._0_1_ = bVar7;
      if (bVar7 != 0x5f) {
        if (9 < (byte)(bVar7 - 0x30)) goto LAB_0034e129;
        SmallVectorBase<char>::emplace_back<char_const&>
                  (&floatChars.super_SmallVectorBase<char>,(char *)&intVal);
        pbVar4 = (byte *)this->sourceBuffer;
        bVar8 = true;
      }
      pbVar4 = pbVar4 + 1;
      this->sourceBuffer = (char *)pbVar4;
    } while( true );
  }
LAB_0034e144:
  sVar3 = floatChars.super_SmallVectorBase<char>.len;
  timeSuffix.super__Optional_base<slang::TimeUnit,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeUnit>._M_engaged = false;
  local_f5 = *pbVar4;
  if ((local_f5 & 0xdf) == 0x45) {
    if (floatChars.super_SmallVectorBase<char>.len == 0) {
      lexNumericLiteral::anon_class_16_2_832c79d4::operator()(&populateChars);
    }
    intVal.super_SVIntStorage.field_0.val._0_1_ = 0x65;
    SmallVectorBase<char>::emplace_back<char>
              (&floatChars.super_SmallVectorBase<char>,(char *)&intVal);
    pcVar5 = this->sourceBuffer;
    local_f5 = pcVar5[1];
    if ((local_f5 == 0x2d) || (local_f5 == 0x2b)) {
      SmallVectorBase<char>::emplace_back<char_const&>
                (&floatChars.super_SmallVectorBase<char>,(char *)&local_f5);
      uVar11 = 2;
      pcVar5 = this->sourceBuffer;
      local_f5 = pcVar5[2];
    }
    else {
      uVar11 = 1;
    }
    uVar10 = (ulong)uVar11;
    bVar8 = false;
    do {
      if (local_f5 != 0x5f) {
        if (9 < (byte)(local_f5 - 0x30)) goto LAB_0034e220;
        SmallVectorBase<char>::emplace_back<char_const&>
                  (&floatChars.super_SmallVectorBase<char>,(char *)&local_f5);
        pcVar5 = this->sourceBuffer;
        bVar8 = true;
      }
      local_f5 = pcVar5[uVar10 + 1];
      uVar10 = uVar10 + 1;
    } while( true );
  }
  timeSuffix = lexTimeLiteral(this);
  bVar7 = timeSuffix.super__Optional_base<slang::TimeUnit,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeUnit>._M_engaged;
  if (((ushort)timeSuffix.super__Optional_base<slang::TimeUnit,_true,_true>._M_payload.
               super__Optional_payload_base<slang::TimeUnit> >> 8 & 1) == 0) {
LAB_0034e255:
    if (floatChars.super_SmallVectorBase<char>.len == 0) {
LAB_0034e2c9:
      intVal.super_SVIntStorage.field_0.val = 0;
      intVal.super_SVIntStorage.bitWidth = 1;
      intVal.super_SVIntStorage.signFlag = false;
      intVal.super_SVIntStorage.unknownFlag = false;
      if (digits.super_SmallVectorBase<slang::logic_t>.len != 0) {
        auVar14._8_4_ = (int)(digits.super_SmallVectorBase<slang::logic_t>.len >> 0x20);
        auVar14._0_8_ = digits.super_SmallVectorBase<slang::logic_t>.len;
        auVar14._12_4_ = 0x45300000;
        dVar13 = ceil(((auVar14._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,
                                        (int)digits.super_SmallVectorBase<slang::logic_t>.len) -
                      4503599627370496.0)) * 3.321928094887362);
        if (dVar13 <= 16777215.0) {
          base = (LiteralBase)(long)dVar13;
        }
        else {
          this_00 = addDiag(this,(DiagCode)0x30003,(long)pbVar12 - (long)pcVar1);
          base = ~Binary;
          Diagnostic::operator<<<int>(this_00,0xffffff);
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = in_R9;
        SVInt::fromDigits((bitwidth_t)&value,base,true,false,
                          (span<const_slang::logic_t,_18446744073709551615UL>)(auVar2 << 0x40));
        SVInt::operator=(&intVal,(SVInt *)&value);
        SVInt::~SVInt((SVInt *)&value);
        SVInt::shrinkToFit(&intVal);
      }
      ctx = (EVP_PKEY_CTX *)0x5;
      TVar15 = create<slang::SVInt&>(this,IntegerLiteral,&intVal);
      SVInt::~SVInt(&intVal);
      goto LAB_0034e3dc;
    }
  }
  else if (floatChars.super_SmallVectorBase<char>.len == 0) {
    lexNumericLiteral::anon_class_16_2_832c79d4::operator()(&populateChars);
    goto LAB_0034e255;
  }
  intVal.super_SVIntStorage.field_0.val = intVal.super_SVIntStorage.field_0.val & 0xffffffffffffff00
  ;
  SmallVectorBase<char>::emplace_back<char>(&floatChars.super_SmallVectorBase<char>,(char *)&intVal)
  ;
  piVar6 = __errno_location();
  *piVar6 = 0;
  value = strtod(floatChars.super_SmallVectorBase<char>.data_,(char **)&intVal);
  outOfRange = *piVar6 == 0x22;
  uVar11 = bVar7 & 1 | 8;
  ctx = (EVP_PKEY_CTX *)(ulong)uVar11;
  TVar15 = create<double&,bool&,std::optional<slang::TimeUnit>&>
                     (this,(TokenKind)uVar11,&value,&outOfRange,&timeSuffix);
LAB_0034e3dc:
  SmallVectorBase<char>::cleanup(&floatChars.super_SmallVectorBase<char>,ctx);
  SmallVectorBase<slang::logic_t>::cleanup(&digits.super_SmallVectorBase<slang::logic_t>,ctx);
  return TVar15;
}

Assistant:

Token Lexer::lexNumericLiteral() {
    // have to check for the "1step" magic keyword
    static const char OneStepText[] = "1step";
    for (int i = 0; i < (int)sizeof(OneStepText) - 1; i++) {
        if (peek(i) != OneStepText[i])
            break;
        if (i == sizeof(OneStepText) - 2) {
            advance(sizeof(OneStepText) - 1);
            return create(TokenKind::OneStep);
        }
    }

    // scan past leading zeros
    while (peek() == '0')
        advance();

    // Keep track of digits as we iterate through them; convert them
    // into logic_t to pass into the SVInt parsing method. If it turns out
    // that this is actually a float, we'll go back and populate `floatChars`
    // instead. Since we expect many more ints than floats, it makes sense to
    // not waste time populating that array up front.
    size_t startOfNum = currentOffset();
    SmallVector<logic_t> digits;
    SmallVector<char> floatChars;

    while (true) {
        char c = peek();
        if (c == '_')
            advance();
        else if (!isDecimalDigit(c))
            break;
        else {
            digits.push_back(logic_t(getDigitValue(c)));
            advance();
        }
    }

    auto populateChars = [&]() {
        if (digits.empty())
            floatChars.push_back('0');
        else {
            for (auto d : digits)
                floatChars.push_back(char((char)d.value + '0'));
        }
    };

    // Check for fractional digits.
    if (peek() == '.') {
        advance();
        populateChars();
        floatChars.push_back('.');

        bool any = false;
        while (true) {
            char c = peek();
            if (c == '_')
                advance();
            else if (!isDecimalDigit(c))
                break;
            else {
                any = true;
                floatChars.push_back(c);
                advance();
            }
        }

        if (!any)
            floatChars.push_back('0');
    }

    // Check for an exponent. Note that this case can be indistinguishable from
    // the vector digits for a hex literal, so we can't issue any errors here if
    // we don't have a decimal point (from above).
    //
    // Consider this nasty case we need to support:
    // `FOO 3e+2
    // If `FOO is defined to be 'h this represents an expression: 62 + 2
    // Otherwise, this represents a real literal: 300.0

    std::optional<TimeUnit> timeSuffix;
    char c = peek();
    if (c == 'e' || c == 'E') {
        bool hasDecimal = !floatChars.empty();
        if (!hasDecimal)
            populateChars();

        floatChars.push_back('e');

        // skip over leading sign
        int index = 1;
        c = peek(index);
        if (c == '+' || c == '-') {
            floatChars.push_back(c);
            c = peek(++index);
        }

        bool any = false;
        while (true) {
            if (c == '_')
                c = peek(++index);
            else if (!isDecimalDigit(c))
                break;
            else {
                any = true;
                floatChars.push_back(c);
                c = peek(++index);
            }
        }

        if (any || hasDecimal) {
            advance(index);
            if (!any)
                floatChars.push_back('1');
        }
        else {
            // This isn't a float, it's probably a hex literal. Back up (by not calling advance)
            // and clear out the floatChars array so we don't think it should be a float.
            floatChars.clear();
        }
    }
    else {
        // Check for a time literal suffix directly adjacent. Time literal
        // values are always interpreted as doubles.
        timeSuffix = lexTimeLiteral();
        if (timeSuffix && floatChars.empty())
            populateChars();
    }

    if (!floatChars.empty()) {
        // We have a floating point result. Let the standard library do the heavy lifting of
        // converting and rounding correctly. Note that we depend on this code returning
        // 0 for underflow and +inf for overflow.
        floatChars.push_back('\0');

        char* end;
        errno = 0;
        double value = strtod(floatChars.data(), &end);
        SLANG_ASSERT(end == floatChars.end() - 1); // should never error

        // If we had an overflow or underflow, errno is now ERANGE. We can't warn here in case
        // this turns out to actually be a hex literal. Have the token carry this info so someone
        // can check it later if they care.
        bool outOfRange = errno == ERANGE;

        return create(timeSuffix ? TokenKind::TimeLiteral : TokenKind::RealLiteral, value,
                      outOfRange, timeSuffix);
    }

    // normal numeric literal
    SVInt intVal;
    if (!digits.empty()) {
        double bitsDbl = ceil(BitsPerDecimal * double(digits.size()));
        bitwidth_t bits;
        if (bitsDbl <= double(SVInt::MAX_BITS))
            bits = (bitwidth_t)bitsDbl;
        else {
            addDiag(diag::LiteralSizeTooLarge, startOfNum) << (int)SVInt::MAX_BITS;
            bits = SVInt::MAX_BITS;
        }

        intVal = SVInt::fromDigits(bits, LiteralBase::Decimal, false, false, digits);
        intVal.shrinkToFit();
    }

    return create(TokenKind::IntegerLiteral, intVal);
}